

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCountedObjectImpl.hpp
# Opt level: O0

void __thiscall
Diligent::RefCountersImpl::ObjectWrapper<Diligent::SwapChainVkImpl,_Diligent::IMemoryAllocator>::
DestroyObject(ObjectWrapper<Diligent::SwapChainVkImpl,_Diligent::IMemoryAllocator> *this)

{
  SwapChainVkImpl *this_00;
  void *in_RSI;
  ObjectWrapper<Diligent::SwapChainVkImpl,_Diligent::IMemoryAllocator> *this_local;
  
  if (this->m_pAllocator == (IMemoryAllocator *)0x0) {
    this_00 = this->m_pObject;
    if (this_00 != (SwapChainVkImpl *)0x0) {
      SwapChainVkImpl::~SwapChainVkImpl(this_00);
      RefCountedObject<Diligent::ISwapChainVk>::operator_delete
                ((RefCountedObject<Diligent::ISwapChainVk> *)this_00,in_RSI);
    }
  }
  else {
    SwapChainVkImpl::~SwapChainVkImpl(this->m_pObject);
    (*this->m_pAllocator->_vptr_IMemoryAllocator[1])(this->m_pAllocator,this->m_pObject);
  }
  return;
}

Assistant:

virtual void DestroyObject() override final
        {
            if (m_pAllocator)
            {
                m_pObject->~ObjectType();
                m_pAllocator->Free(m_pObject);
            }
            else
            {
                delete m_pObject;
            }
        }